

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVM.cpp
# Opt level: O2

void __thiscall NanoVM::NanoVM(NanoVM *this,string *fileName)

{
  char cVar1;
  uint64_t uVar2;
  long lVar3;
  uchar *puVar4;
  ifstream file;
  
  (this->cpu).codeSize = 0;
  (this->cpu).stackSize = 0;
  (this->cpu).codeBase = (uchar *)0x0;
  (this->cpu).stackBase = (uchar *)0x0;
  (this->cpu).registers[8] = 0;
  (this->cpu).registers[9] = 0;
  (this->cpu).registers[6] = 0;
  (this->cpu).registers[7] = 0;
  (this->cpu).registers[4] = 0;
  (this->cpu).registers[5] = 0;
  (this->cpu).registers[2] = 0;
  (this->cpu).registers[3] = 0;
  (this->cpu).registers[0] = 0;
  (this->cpu).registers[1] = 0;
  (this->cpu).bytecodeSize = 0;
  std::ifstream::ifstream(&file,(string *)fileName,_S_in|_S_bin|_S_ate);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::operator<<((ostream *)&std::cout,"Unable to open file");
  }
  else {
    uVar2 = std::istream::tellg();
    lVar3 = ((long)uVar2 / 0x1000) * 0x1000;
    (this->cpu).codeSize = lVar3 + 0x1000;
    (this->cpu).stackSize = 0x1000;
    puVar4 = (uchar *)malloc(lVar3 + 0x200a);
    (this->cpu).codeBase = puVar4;
    std::istream::seekg((long)&file,_S_beg);
    std::istream::read((char *)&file,(long)(this->cpu).codeBase);
    std::ifstream::close();
    (this->cpu).bytecodeSize = uVar2;
    puVar4 = (this->cpu).codeBase;
    uVar2 = (this->cpu).codeSize;
    (this->cpu).stackBase = puVar4 + uVar2;
    (puVar4 + uVar2 + 0x10)[0] = '\0';
    (puVar4 + uVar2 + 0x10)[1] = '\0';
    puVar4 = puVar4 + uVar2;
    puVar4[0] = '\0';
    puVar4[1] = '\0';
    puVar4[2] = '\0';
    puVar4[3] = '\0';
    puVar4[4] = '\0';
    puVar4[5] = '\0';
    puVar4[6] = '\0';
    puVar4[7] = '\0';
    puVar4[8] = '\0';
    puVar4[9] = '\0';
    puVar4[10] = '\0';
    puVar4[0xb] = '\0';
    puVar4[0xc] = '\0';
    puVar4[0xd] = '\0';
    puVar4[0xe] = '\0';
    puVar4[0xf] = '\0';
    uVar2 = (this->cpu).codeSize;
    (this->cpu).registers[7] = uVar2;
    (this->cpu).registers[6] = uVar2;
    (this->cpu).registers[8] = 0;
  }
  std::ifstream::~ifstream(&file);
  return;
}

Assistant:

NanoVM::NanoVM(std::string fileName) {
	memset(&cpu, 0x00, sizeof(cpu));
	// Zero out registers
	memset(cpu.registers, 0x00, sizeof(cpu.registers));

	std::streampos size;

	std::ifstream file(fileName, std::ios::in | std::ios::binary | std::ios::ate);
	if (file.is_open())
	{
		size = file.tellg();

		cpu.codeSize = (NANOVM_PAGE_SIZE * (1 + (size / NANOVM_PAGE_SIZE)));
		cpu.stackSize = NANOVM_PAGE_SIZE;

		// allocate whole memory, code pages, stack, +10 bytes
		// +10 bytes is for instruction fetching which might read more bytes than the instruction size
		// This avoids reading memory out side of the VM
		cpu.codeBase = (unsigned char*)malloc(cpu.stackSize + 10 + cpu.codeSize);

		file.seekg(0, std::ios::beg);
		file.read((char*)cpu.codeBase, size);
		file.close();

		cpu.bytecodeSize = size;
		// Set stack base. Stack grows up instead of down like in x86
		cpu.stackBase = cpu.codeBase + cpu.codeSize;
		// Zero out stack + the last 10 bytes
		memset(cpu.stackBase, 0x00, sizeof(cpu.stackSize) + 10);
		cpu.registers[esp] = cpu.codeSize;
		cpu.registers[bp] = cpu.codeSize;
		// Set IP to the beginning of code
		cpu.registers[ip] = 0;
	}
	else std::cout << "Unable to open file";
}